

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_BakeFontBitmap
              (uchar *data,int offset,float pixel_height,uchar *pixels,int pw,int ph,int first_char,
              int num_chars,stbtt_bakedchar *chardata)

{
  int iVar1;
  int iVar2;
  int glyph_index;
  int out_h;
  long lVar3;
  int out_w;
  ulong uVar4;
  int iVar5;
  undefined1 local_c8 [8];
  stbtt_fontinfo f;
  int lsb;
  int local_5c;
  int local_58;
  int advance;
  int x1;
  int y1;
  int local_48;
  int local_44;
  int local_40;
  int x0;
  int y0;
  float local_34;
  
  local_c8 = (undefined1  [8])0x0;
  y0 = ph;
  local_34 = pixel_height;
  iVar2 = stbtt_InitFont((stbtt_fontinfo *)local_c8,data,offset);
  if (iVar2 == 0) {
    x0 = -1;
  }
  else {
    local_48 = pw;
    memset(pixels,0,(long)(y0 * pw));
    if (num_chars < 1) {
      x0 = 1;
    }
    else {
      lVar3 = (long)f.head;
      local_34 = local_34 /
                 (float)(int)(((int)(short)((ushort)*(byte *)((long)f.userdata + lVar3 + 4) << 8) |
                              (uint)*(byte *)((long)f.userdata + lVar3 + 5)) -
                             ((int)(short)((ushort)*(byte *)((long)f.userdata + lVar3 + 6) << 8) |
                             (uint)*(byte *)((long)f.userdata + lVar3 + 7)));
      uVar4 = 0;
      iVar5 = 1;
      iVar2 = 1;
      x0 = 1;
      do {
        glyph_index = stbtt_FindGlyphIndex((stbtt_fontinfo *)local_c8,first_char + (int)uVar4);
        stbtt_GetGlyphHMetrics((stbtt_fontinfo *)local_c8,glyph_index,&local_5c,&f.indexToLocFormat)
        ;
        stbtt_GetGlyphBitmapBoxSubpixel
                  ((stbtt_fontinfo *)local_c8,glyph_index,local_34,local_34,0.0,0.0,&local_44,
                   &local_40,&local_58,&advance);
        out_w = local_58 - local_44;
        out_h = advance - local_40;
        if (local_48 <= iVar5 + out_w + 1) {
          iVar5 = 1;
          iVar2 = x0;
        }
        x1 = iVar2 + out_h + 1;
        if (y0 <= x1) {
          return -(int)uVar4;
        }
        iVar1 = iVar5 + out_w;
        if (local_48 <= iVar1) {
          __assert_fail("x+gw < pw",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                        ,0xa04,
                        "int stbtt_BakeFontBitmap(const unsigned char *, int, float, unsigned char *, int, int, int, int, stbtt_bakedchar *)"
                       );
        }
        y1 = iVar2 + out_h;
        stbtt_MakeGlyphBitmapSubpixel
                  ((stbtt_fontinfo *)local_c8,pixels + (long)(iVar2 * local_48) + (long)iVar5,out_w,
                   out_h,local_48,local_34,local_34,0.0,0.0,glyph_index);
        chardata->x0 = (unsigned_short)iVar5;
        chardata->y0 = (unsigned_short)iVar2;
        chardata->x1 = (unsigned_short)iVar1;
        chardata->y1 = (unsigned_short)y1;
        chardata->xadvance = (float)local_5c * local_34;
        chardata->xoff = (float)local_44;
        chardata->yoff = (float)local_40;
        iVar5 = iVar1 + 1;
        if (x0 <= y1) {
          x0 = x1;
        }
        uVar4 = uVar4 + 1;
        chardata = chardata + 1;
      } while ((uint)num_chars != uVar4);
    }
  }
  return x0;
}

Assistant:

STBTT_DEF int stbtt_BakeFontBitmap(const unsigned char *data, int offset,  // font location (use offset=0 for plain .ttf)
                                float pixel_height,                     // height of font in pixels
                                unsigned char *pixels, int pw, int ph,  // bitmap to be filled in
                                int first_char, int num_chars,          // characters to bake
                                stbtt_bakedchar *chardata)
{
   float scale;
   int x,y,bottom_y, i;
   stbtt_fontinfo f;
   f.userdata = NULL;
   if (!stbtt_InitFont(&f, data, offset))
      return -1;
   STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels
   x=y=1;
   bottom_y = 1;

   scale = stbtt_ScaleForPixelHeight(&f, pixel_height);

   for (i=0; i < num_chars; ++i) {
      int advance, lsb, x0,y0,x1,y1,gw,gh;
      int g = stbtt_FindGlyphIndex(&f, first_char + i);
      stbtt_GetGlyphHMetrics(&f, g, &advance, &lsb);
      stbtt_GetGlyphBitmapBox(&f, g, scale,scale, &x0,&y0,&x1,&y1);
      gw = x1-x0;
      gh = y1-y0;
      if (x + gw + 1 >= pw)
         y = bottom_y, x = 1; // advance to next row
      if (y + gh + 1 >= ph) // check if it fits vertically AFTER potentially moving to next row
         return -i;
      STBTT_assert(x+gw < pw);
      STBTT_assert(y+gh < ph);
      stbtt_MakeGlyphBitmap(&f, pixels+x+y*pw, gw,gh,pw, scale,scale, g);
      chardata[i].x0 = (stbtt_int16) x;
      chardata[i].y0 = (stbtt_int16) y;
      chardata[i].x1 = (stbtt_int16) (x + gw);
      chardata[i].y1 = (stbtt_int16) (y + gh);
      chardata[i].xadvance = scale * advance;
      chardata[i].xoff     = (float) x0;
      chardata[i].yoff     = (float) y0;
      x = x + gw + 1;
      if (y+gh+1 > bottom_y)
         bottom_y = y+gh+1;
   }
   return bottom_y;
}